

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void AddByte(Lexer *lexer,tmbchar ch)

{
  uint uVar1;
  tmbstr ptVar2;
  uint local_24;
  uint prev;
  uint allocAmt;
  tmbstr buf;
  tmbchar ch_local;
  Lexer *lexer_local;
  
  if (lexer->lexlength <= lexer->lexsize + 2) {
    uVar1 = lexer->lexlength;
    local_24 = uVar1;
    while (local_24 <= lexer->lexsize + 2) {
      if (local_24 == 0) {
        local_24 = 0x2000;
      }
      else {
        local_24 = local_24 << 1;
      }
      if (local_24 < uVar1) {
        (*lexer->allocator->vtbl->panic)
                  (lexer->allocator,"\nPanic: out of internal memory!\nDocument input too big!\n");
      }
    }
    ptVar2 = (tmbstr)(*lexer->allocator->vtbl->realloc)
                               (lexer->allocator,lexer->lexbuf,(size_t)local_24);
    if (ptVar2 != (tmbstr)0x0) {
      memset(ptVar2 + lexer->lexlength,0,(ulong)(local_24 - lexer->lexlength));
      lexer->lexbuf = ptVar2;
      lexer->lexlength = local_24;
    }
  }
  uVar1 = lexer->lexsize;
  lexer->lexsize = uVar1 + 1;
  lexer->lexbuf[uVar1] = ch;
  lexer->lexbuf[lexer->lexsize] = '\0';
  return;
}

Assistant:

static void AddByte( Lexer *lexer, tmbchar ch )
{
    if ( lexer->lexsize + 2 >= lexer->lexlength )
    {
        tmbstr buf = NULL;
        uint allocAmt = lexer->lexlength;
        uint prev = allocAmt; /* Is. #761 */
        while ( lexer->lexsize + 2 >= allocAmt )
        {
            if ( allocAmt == 0 )
                allocAmt = 8192;
            else
                allocAmt *= 2;
            if (allocAmt < prev) /* Is. #761 - watch for wrap - and */
                TidyPanic(lexer->allocator, "\nPanic: out of internal memory!\nDocument input too big!\n");
        }
        buf = (tmbstr) TidyRealloc( lexer->allocator, lexer->lexbuf, allocAmt );
        if ( buf )
        {
          TidyClearMemory( buf + lexer->lexlength, 
                           allocAmt - lexer->lexlength );
          lexer->lexbuf = buf;
          lexer->lexlength = allocAmt;
        }
    }

    lexer->lexbuf[ lexer->lexsize++ ] = ch;
    lexer->lexbuf[ lexer->lexsize ]   = '\0';  /* debug */
}